

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::FirstState<duckdb::string_t>,duckdb::string_t,duckdb::FirstFunctionString<true,false>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  ulong uVar3;
  idx_t iVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_90;
  AggregateUnaryInput local_48;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_90.data = (data_ptr_t)&input->validity;
    local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      puVar5 = (unsigned_long *)0x0;
      uVar3 = 0;
      local_90.sel = (SelectionVector *)aggr_input_data;
      do {
        puVar6 = puVar5 + 8;
        if (count <= puVar5 + 8) {
          puVar6 = (unsigned_long *)count;
        }
        while (puVar5 < puVar6) {
          FirstFunctionString<true,false>::
          Operation<duckdb::string_t,duckdb::FirstState<duckdb::string_t>,duckdb::FirstFunctionString<true,false>>
                    ((FirstState<duckdb::string_t> *)state,
                     (string_t *)(pdVar1 + (long)puVar5 * 0x10),(AggregateUnaryInput *)&local_90);
          puVar5 = (unsigned_long *)
                   ((long)local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   + 1);
          local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    local_90.data = (data_ptr_t)&input->validity;
    local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    local_90.sel = (SelectionVector *)aggr_input_data;
    FirstFunctionString<true,false>::
    Operation<duckdb::string_t,duckdb::FirstState<duckdb::string_t>,duckdb::FirstFunctionString<true,false>>
              ((FirstState<duckdb::string_t> *)state,(string_t *)input->data,
               (AggregateUnaryInput *)&local_90);
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_90);
    Vector::ToUnifiedFormat(input,count,&local_90);
    local_48.input_mask = &local_90.validity;
    local_48.input = aggr_input_data;
    if (count != 0) {
      psVar2 = (local_90.sel)->sel_vector;
      iVar4 = 0;
      do {
        local_48.input_idx = iVar4;
        if (psVar2 != (sel_t *)0x0) {
          local_48.input_idx = (idx_t)psVar2[iVar4];
        }
        FirstFunctionString<true,false>::
        Operation<duckdb::string_t,duckdb::FirstState<duckdb::string_t>,duckdb::FirstFunctionString<true,false>>
                  ((FirstState<duckdb::string_t> *)state,
                   (string_t *)(local_90.data + local_48.input_idx * 0x10),&local_48);
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
    if (local_90.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}